

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

int __thiscall Polynomial::createMaxMinNode(Polynomial *this,int first_loc,int second_loc,char op)

{
  int iVar1;
  iterator __position;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> args;
  allocator_type local_59;
  operand local_58;
  vector<int,_std::allocator<int>_> local_38;
  
  this->mResultLocation =
       (int)((ulong)((long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_58;
  local_58.op = first_loc;
  local_58._4_4_ = second_loc;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__l,&local_59);
  local_58.op = op == '<' | MAX;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            (&local_58.args,(vector<int,_std::allocator<int>_> *)&local_38);
  std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::
  emplace_back<Polynomial::operand>
            ((vector<Polynomial::operand,_std::allocator<Polynomial::operand>_> *)&this->mOperands,
             &local_58);
  if (local_58.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_58.op = PLUS;
  __position._M_current =
       (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues,__position,
               (int *)&local_58);
  }
  else {
    *__position._M_current = 0;
    (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar1 = this->mResultLocation;
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar1;
}

Assistant:

int Polynomial::createMaxMinNode(int first_loc, int second_loc, char op)
{
  mResultLocation = mEvaluationValues.size();
  std::vector<int> args { first_loc, second_loc};
  operandType maxmin = (op == MIN_OPERATOR ? operandType::MIN : operandType::MAX);
  mOperands.push_back({maxmin, args});
  mEvaluationValues.push_back(0); // make space in evaluation array for the output.
  return mResultLocation;
}